

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain_struct
          (CompilerHLSL *this,string *lhs,SPIRAccessChain *chain)

{
  size_t sVar1;
  uint32_t uVar2;
  SPIRType *type;
  SPIRType *pSVar3;
  uint32_t index;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_118;
  string local_f8;
  SPIRAccessChain local_d8;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(chain->super_IVariant).field_0xc);
  SPIRAccessChain::SPIRAccessChain(&local_d8,chain);
  sVar1 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  for (uVar4 = 0; (uint)sVar1 != uVar4; uVar4 = uVar4 + 1) {
    index = (uint32_t)uVar4;
    uVar2 = Compiler::type_struct_member_offset((Compiler *)this,type,index);
    local_d8.static_index = uVar2 + chain->static_index;
    local_d8.super_IVariant._12_4_ =
         (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
         [uVar4].id;
    local_d8.row_major_matrix = false;
    local_d8.matrix_stride = 0;
    local_d8.array_stride = 0;
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_d8.super_IVariant._12_4_);
    if (1 < pSVar3->columns) {
      uVar2 = Compiler::type_struct_member_matrix_stride((Compiler *)this,type,index);
      local_d8.matrix_stride = uVar2;
      local_d8.row_major_matrix =
           Compiler::has_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                      DecorationRowMajor);
    }
    if ((pSVar3->array).super_VectorView<unsigned_int>.buffer_size != 0) {
      uVar2 = Compiler::type_struct_member_array_stride((Compiler *)this,type,index);
      local_d8.array_stride = uVar2;
    }
    CompilerGLSL::to_member_name_abi_cxx11_(&local_118,&this->super_CompilerGLSL,type,index);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
              (&local_f8,(spirv_cross *)lhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2fcc03,
               (char (*) [2])&local_118,in_R8);
    read_access_chain(this,(string *)0x0,&local_f8,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    ::std::__cxx11::string::~string((string *)&local_118);
  }
  SPIRAccessChain::~SPIRAccessChain(&local_d8);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain_struct(const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);
	auto subchain = chain;
	uint32_t member_count = uint32_t(type.member_types.size());

	for (uint32_t i = 0; i < member_count; i++)
	{
		uint32_t offset = type_struct_member_offset(type, i);
		subchain.static_index = chain.static_index + offset;
		subchain.basetype = type.member_types[i];

		subchain.matrix_stride = 0;
		subchain.array_stride = 0;
		subchain.row_major_matrix = false;

		auto &member_type = get<SPIRType>(subchain.basetype);
		if (member_type.columns > 1)
		{
			subchain.matrix_stride = type_struct_member_matrix_stride(type, i);
			subchain.row_major_matrix = has_member_decoration(type.self, i, DecorationRowMajor);
		}

		if (!member_type.array.empty())
			subchain.array_stride = type_struct_member_array_stride(type, i);

		read_access_chain(nullptr, join(lhs, ".", to_member_name(type, i)), subchain);
	}
}